

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Iterator.h
# Opt level: O1

void __thiscall arangodb::velocypack::ArrayIterator::next(ArrayIterator *this)

{
  ulong uVar1;
  byte *local_10;
  
  if (this->_position != this->_size) {
    this->_position = this->_position + 1;
    local_10 = this->_current;
    uVar1 = (ulong)"\x01\x01"[*local_10];
    if (uVar1 == 0) {
      uVar1 = SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::byteSizeDynamic
                        ((SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *)
                         &local_10,local_10);
    }
    this->_current = this->_current + uVar1;
  }
  return;
}

Assistant:

[[nodiscard]] bool valid() const noexcept { return _position != _size; }